

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_bloomshader.cpp
# Opt level: O3

void __thiscall FBloomCombineShader::Bind(FBloomCombineShader *this)

{
  FShaderProgram *this_00;
  GLint GVar1;
  
  this_00 = &this->mShader;
  if ((this->mShader).mProgram == 0) {
    FShaderProgram::Compile(this_00,Vertex,"shaders/glsl/screenquad.vp",(char *)"",0x14a);
    FShaderProgram::Compile(this_00,Fragment,"shaders/glsl/bloomcombine.fp",(char *)"",0x14a);
    FShaderProgram::SetFragDataLocation(this_00,0,"FragColor");
    FShaderProgram::Link(this_00,"shaders/glsl/bloomcombine");
    FShaderProgram::SetAttribLocation(this_00,0,"PositionInProjection");
    GVar1 = (*_ptrc_glGetUniformLocation)((this->mShader).mProgram,"Bloom");
    (this->BloomTexture).mIndex = GVar1;
    (this->BloomTexture).mBuffer = -1;
  }
  FShaderProgram::Bind(this_00);
  return;
}

Assistant:

void FBloomCombineShader::Bind()
{
	if (!mShader)
	{
		mShader.Compile(FShaderProgram::Vertex, "shaders/glsl/screenquad.vp", "", 330);
		mShader.Compile(FShaderProgram::Fragment, "shaders/glsl/bloomcombine.fp", "", 330);
		mShader.SetFragDataLocation(0, "FragColor");
		mShader.Link("shaders/glsl/bloomcombine");
		mShader.SetAttribLocation(0, "PositionInProjection");
		BloomTexture.Init(mShader, "Bloom");
	}
	mShader.Bind();
}